

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getTagFromName
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Name name)

{
  Tag *pTVar1;
  string local_b0;
  Err local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 auStack_30 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  auStack_30 = name.super_IString.str._M_len;
  pTVar1 = Module::getTagOrNull(this->wasm,name);
  if (pTVar1 == (Tag *)0x0) {
    IString::toString_abi_cxx11_(&local_b0,(IString *)auStack_30);
    std::operator+(&local_50,"tag $",&local_b0);
    std::operator+(&local_70,&local_50," does not exist");
    Lexer::err(&local_90,&this->in,&local_70);
    std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Name,wasm::Err> *)__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err> = auStack_30;
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) =
         name_local.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getTagFromName(Name name) {
    if (!wasm.getTagOrNull(name)) {
      return in.err("tag $" + name.toString() + " does not exist");
    }
    return name;
  }